

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlCreateObjectWithTag(JL_DATA_TYPE Type,size_t Tag,JlDataObject **pNewObject)

{
  _Bool _Var1;
  JlDataObject *pJVar2;
  JlDataObject *object;
  JL_STATUS jlStatus;
  JlDataObject **pNewObject_local;
  size_t Tag_local;
  JL_DATA_TYPE Type_local;
  
  if (pNewObject == (JlDataObject **)0x0) {
    object._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    *pNewObject = (JlDataObject *)0x0;
    _Var1 = IsDataTypeValid(Type);
    if (_Var1) {
      pJVar2 = (JlDataObject *)WjTestLib_Calloc(0x28,1);
      if (pJVar2 == (JlDataObject *)0x0) {
        object._4_4_ = JL_STATUS_OUT_OF_MEMORY;
      }
      else {
        pJVar2->Type = Type;
        pJVar2->Tag = Tag;
        *pNewObject = pJVar2;
        object._4_4_ = JL_STATUS_SUCCESS;
      }
    }
    else {
      object._4_4_ = JL_STATUS_INVALID_TYPE;
    }
  }
  return object._4_4_;
}

Assistant:

JL_STATUS
    JlCreateObjectWithTag
    (
        JL_DATA_TYPE    Type,
        size_t          Tag,
        JlDataObject**  pNewObject
    )
{
    JL_STATUS jlStatus;
    JlDataObject* object = NULL;

    if( NULL != pNewObject )
    {
        *pNewObject = NULL;

        if( IsDataTypeValid( Type ) )
        {
            object = JlNew( JlDataObject );
            if( NULL != object )
            {
                object->Type = Type;
                object->Tag = Tag;
                *pNewObject = object;
                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }
        }
        else
        {
            jlStatus = JL_STATUS_INVALID_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}